

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_quaternion.cpp
# Opt level: O0

ON_3dVector * __thiscall
ON_Quaternion::Rotate(ON_3dVector *__return_storage_ptr__,ON_Quaternion *this,ON_3dVector v)

{
  double local_80;
  undefined1 local_58 [8];
  ON_Quaternion qv;
  ON_Quaternion qinv;
  double x;
  ON_Quaternion *this_local;
  
  local_80 = this->d * this->d + this->c * this->c + this->a * this->a + this->b * this->b;
  if (local_80 <= 2.2250738585072014e-308) {
    local_80 = 0.0;
  }
  else {
    local_80 = 1.0 / local_80;
  }
  ON_Quaternion((ON_Quaternion *)&qv.d,this->a * local_80,-this->b * local_80,-this->c * local_80,
                -this->d * local_80);
  ON_Quaternion((ON_Quaternion *)local_58,-this->d * v.z + -this->b * v.x + -(this->c * v.y),
                -this->d * v.y + this->a * v.x + this->c * v.z,
                this->d * v.x + this->a * v.y + -(this->b * v.z),
                -this->c * v.x + this->a * v.z + this->b * v.y);
  __return_storage_ptr__->x =
       -qv.c * qinv.b + qv.b * qinv.c + (double)local_58 * qinv.a + qv.a * qv.d;
  __return_storage_ptr__->y =
       qv.c * qinv.a + qv.b * qv.d + (double)local_58 * qinv.b + -(qv.a * qinv.c);
  __return_storage_ptr__->z =
       qv.c * qv.d + -qv.b * qinv.a + (double)local_58 * qinv.c + qv.a * qinv.b;
  return __return_storage_ptr__;
}

Assistant:

ON_3dVector ON_Quaternion::Rotate(ON_3dVector v) const
{
  // returns q*(0,v.x,v.y,v.z)*Inverse(q)
  double x = a*a + b*b + c*c + d*d;
  x = ( x > ON_DBL_MIN ) ? 1.0/x : 0.0;
  const ON_Quaternion qinv(a*x,-b*x,-c*x,-d*x);

  const ON_Quaternion qv( -b*v.x - c*v.y - d*v.z,
                           a*v.x + c*v.z - d*v.y,
                           a*v.y - b*v.z + d*v.x,
                           a*v.z + b*v.y - c*v.x);

  v.x = qv.a*qinv.b + qv.b*qinv.a + qv.c*qinv.d - qv.d*qinv.c;
  v.y = qv.a*qinv.c - qv.b*qinv.d + qv.c*qinv.a + qv.d*qinv.b;
  v.z = qv.a*qinv.d + qv.b*qinv.c - qv.c*qinv.b + qv.d*qinv.a;
  return v;
}